

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O0

IGUIScrollBar * __thiscall
irr::gui::CGUIEnvironment::addScrollBar
          (CGUIEnvironment *this,bool horizontal,rect<int> *rectangle,IGUIElement *parent,s32 id)

{
  rect<int> rectangle_00;
  IGUIScrollBar *pIVar1;
  vector2d<int> in_RCX;
  vector2d<int> in_RDX;
  undefined1 in_SIL;
  IGUIScrollBar *bar;
  IReferenceCounted *this_00;
  undefined7 in_stack_ffffffffffffffb8;
  CGUIScrollBar *in_stack_ffffffffffffffd0;
  
  pIVar1 = (IGUIScrollBar *)operator_new(0x1a0);
  this_00 = *(IReferenceCounted **)in_RDX;
  rectangle_00.LowerRightCorner = in_RDX;
  rectangle_00.UpperLeftCorner = in_RCX;
  CGUIScrollBar::CGUIScrollBar
            (in_stack_ffffffffffffffd0,SUB81((ulong)*(undefined8 *)((long)in_RDX + 8) >> 0x38,0),
             (IGUIEnvironment *)this_00,
             (IGUIElement *)(CONCAT17(in_SIL,in_stack_ffffffffffffffb8) & 0x1ffffffffffffff),
             (s32)((ulong)pIVar1 >> 0x20),rectangle_00,SUB81((ulong)pIVar1 >> 0x18,0));
  IReferenceCounted::drop(this_00);
  return pIVar1;
}

Assistant:

IGUIScrollBar *CGUIEnvironment::addScrollBar(bool horizontal, const core::rect<s32> &rectangle, IGUIElement *parent, s32 id)
{
	IGUIScrollBar *bar = new CGUIScrollBar(horizontal, this, parent ? parent : this, id, rectangle);
	bar->drop();
	return bar;
}